

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict5 *data,int finishing)

{
  int iVar1;
  uint uVar2;
  int ret;
  int finishing_local;
  private_data_conflict5 *data_local;
  archive_write_filter *f_local;
  
  do {
    if ((data->stream).avail_out == 0) {
      iVar1 = __archive_write_filter(f->next_filter,data->compressed,data->compressed_buffer_size);
      if (iVar1 != 0) {
        return -0x1e;
      }
      (data->stream).next_out = data->compressed;
      (data->stream).avail_out = (uInt)data->compressed_buffer_size;
    }
    if ((finishing == 0) && ((data->stream).avail_in == 0)) {
      return 0;
    }
    uVar2 = cm_zlib_deflate((z_streamp)&data->stream,(uint)(finishing != 0) << 2);
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        archive_set_error(f->archive,-1,"GZip compression failed: deflate() call returned status %d"
                          ,(ulong)uVar2);
        return -0x1e;
      }
      return 0;
    }
  } while ((finishing != 0) || ((data->stream).avail_in != 0));
  return 0;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			data->total_out += data->compressed_buffer_size;
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = lzma_code(&(data->stream),
		    finishing ? LZMA_FINISH : LZMA_RUN );

		switch (ret) {
		case LZMA_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case LZMA_STREAM_END:
			/* This return can only occur in finishing case. */
			if (finishing)
				return (ARCHIVE_OK);
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression data error");
			return (ARCHIVE_FATAL);
		case LZMA_MEMLIMIT_ERROR:
			archive_set_error(f->archive, ENOMEM,
			    "lzma compression error: "
			    "%ju MiB would have been needed",
			    (uintmax_t)((lzma_memusage(&(data->stream))
				    + 1024 * 1024 -1)
				/ (1024 * 1024)));
			return (ARCHIVE_FATAL);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression failed:"
			    " lzma_code() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}